

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst_debug_printf_pass.cpp
# Opt level: O3

void __thiscall
spvtools::opt::InstDebugPrintfPass::GenOutputCode
          (InstDebugPrintfPass *this,Instruction *printf_inst,
          vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
          *new_blocks)

{
  pointer pOVar1;
  uint **ppuVar2;
  Instruction *inst;
  bool bVar3;
  char cVar4;
  uint32_t shader_id;
  uint32_t uVar5;
  mapped_type *pmVar6;
  uint **ppuVar7;
  pointer pOVar8;
  bool is_first_operand;
  vector<unsigned_int,_std::allocator<unsigned_int>_> val_ids;
  InstructionBuilder builder;
  undefined1 local_b9;
  long **local_b8;
  undefined8 local_b0;
  code *local_a8;
  code *local_a0;
  Instruction *local_98;
  uint *local_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  long *local_70;
  undefined8 local_68;
  code *local_60;
  code *local_58;
  InstructionBuilder local_50;
  
  local_50.parent_ =
       (new_blocks->
       super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
       .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
  local_50.context_ = (this->super_InstrumentPass).super_Pass.context_;
  local_50.insert_before_.super_iterator.node_ =
       (iterator)
       ((long)&((local_50.parent_)->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
  local_50.preserved_analyses_ = kAnalysisInstrToBlockMapping|kAnalysisBegin;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b9 = 0;
  local_68 = 0;
  local_98 = printf_inst;
  local_70 = (long *)operator_new(0x20);
  inst = local_98;
  *local_70 = (long)&local_b9;
  local_70[1] = (long)&local_88;
  local_70[2] = (long)&local_50;
  local_70[3] = (long)this;
  local_58 = std::
             _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inst_debug_printf_pass.cpp:155:7)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inst_debug_printf_pass.cpp:155:7)>
             ::_M_manager;
  local_b0 = 0;
  local_a0 = std::
             _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:830:17)>
             ::_M_invoke;
  local_a8 = std::
             _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:830:17)>
             ::_M_manager;
  pOVar8 = (local_98->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pOVar1 = (local_98->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_b8 = &local_70;
  if (pOVar8 != pOVar1) {
    do {
      bVar3 = spvIsInIdType(pOVar8->type);
      if (bVar3) {
        ppuVar2 = (uint **)(pOVar8->words).large_data_._M_t.
                           super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           .
                           super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                           ._M_head_impl;
        ppuVar7 = &(pOVar8->words).small_data_;
        if (ppuVar2 != (uint **)0x0) {
          ppuVar7 = ppuVar2;
        }
        local_90 = *ppuVar7;
        if (local_a8 == (code *)0x0) {
          std::__throw_bad_function_call();
        }
        cVar4 = (*local_a0)(&local_b8,&local_90);
        if (cVar4 == '\0') break;
      }
      pOVar8 = pOVar8 + 1;
    } while (pOVar8 != pOVar1);
    if (local_a8 == (code *)0x0) goto LAB_00220e51;
  }
  (*local_a8)(&local_b8,&local_b8,3);
LAB_00220e51:
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,3);
  }
  shader_id = InstructionBuilder::GetUintConstantId
                        (&local_50,(this->super_InstrumentPass).shader_id_);
  uVar5 = inst->unique_id_;
  if (uVar5 != 0) {
    local_b8 = (long **)CONCAT44(local_b8._4_4_,uVar5);
    pmVar6 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&(this->super_InstrumentPass).uid2offset_,(key_type *)&local_b8);
    uVar5 = InstructionBuilder::GetUintConstantId(&local_50,*pmVar6);
    GenDebugStreamWrite(this,shader_id,uVar5,&local_88,&local_50);
    IRContext::KillInst((this->super_InstrumentPass).super_Pass.context_,inst);
    if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  __assert_fail("unique_id_ != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                ,0xfb,"uint32_t spvtools::opt::Instruction::unique_id() const");
}

Assistant:

void InstDebugPrintfPass::GenOutputCode(
    Instruction* printf_inst,
    std::vector<std::unique_ptr<BasicBlock>>* new_blocks) {
  BasicBlock* back_blk_ptr = &*new_blocks->back();
  InstructionBuilder builder(
      context(), back_blk_ptr,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
  // Gen debug printf record validation-specific values. The format string
  // will have its id written. Vectors will need to be broken down into
  // component values. float16 will need to be converted to float32. Pointer
  // and uint64 will need to be converted to two uint32 values. float32 will
  // need to be bitcast to uint32. int32 will need to be bitcast to uint32.
  std::vector<uint32_t> val_ids;
  bool is_first_operand = false;
  printf_inst->ForEachInId(
      [&is_first_operand, &val_ids, &builder, this](const uint32_t* iid) {
        // skip set operand
        if (!is_first_operand) {
          is_first_operand = true;
          return;
        }
        Instruction* opnd_inst = get_def_use_mgr()->GetDef(*iid);
        if (opnd_inst->opcode() == spv::Op::OpString) {
          uint32_t string_id_id = builder.GetUintConstantId(*iid);
          val_ids.push_back(string_id_id);
        } else {
          GenOutputValues(opnd_inst, &val_ids, &builder);
        }
      });
  GenDebugStreamWrite(
      builder.GetUintConstantId(shader_id_),
      builder.GetUintConstantId(uid2offset_[printf_inst->unique_id()]), val_ids,
      &builder);
  context()->KillInst(printf_inst);
}